

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

Reg __thiscall backend::codegen::Codegen::get_or_alloc_vd(Codegen *this,VarId *v_)

{
  bool bVar1;
  RegisterKind RVar2;
  Reg RVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer ppVar6;
  uint *__y;
  pair<const_mir::inst::VarId,_unsigned_int> *in_RSI;
  long in_RDI;
  Reg reg;
  iterator found;
  VarId v;
  VarId *in_stack_ffffffffffffff38;
  VarId *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  VarId *in_stack_ffffffffffffff70;
  Codegen *in_stack_ffffffffffffff78;
  _Self local_48;
  _Self local_40 [3];
  VarId local_28 [2];
  Reg local_4;
  
  mir::inst::VarId::VarId(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  get_collapsed_var(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
       ::find((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
               *)in_stack_ffffffffffffff38,(key_type *)0x214916);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
       ::end((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
              *)in_stack_ffffffffffffff38);
  bVar1 = std::operator!=(local_40,&local_48);
  if (bVar1) {
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_> *)
                        0x21495c);
    RVar2 = arm::register_type(ppVar6->second);
    if (RVar2 != VirtualDoubleVector) {
      __assert_fail("arm::register_type(found->second) == arm::RegisterKind::VirtualDoubleVector",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                    ,0x135,"arm::Reg backend::codegen::Codegen::get_or_alloc_vd(mir::inst::VarId)");
    }
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_> *)
                        0x214997);
    local_4 = ppVar6->second;
  }
  else {
    RVar3 = alloc_vd((Codegen *)0x2149b0);
    __y = (uint *)(in_RDI + 0x30);
    std::pair<const_mir::inst::VarId,_unsigned_int>::pair<mir::inst::VarId_&,_unsigned_int_&,_true>
              (in_RSI,(VarId *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),__y);
    std::
    map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
    ::insert((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
              *)in_RSI,(value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    uVar4 = mir::inst::VarId::operator_cast_to_unsigned_int(&in_RSI->first);
    uVar5 = mir::inst::VarId::operator_cast_to_unsigned_int(local_28);
    local_4 = RVar3;
    if (uVar4 != uVar5) {
      std::pair<const_mir::inst::VarId,_unsigned_int>::
      pair<mir::inst::VarId_&,_unsigned_int_&,_true>
                (in_RSI,(VarId *)CONCAT44(uVar4,in_stack_ffffffffffffff48),__y);
      std::
      map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
      ::insert((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                *)in_RSI,(value_type *)CONCAT44(uVar4,in_stack_ffffffffffffff48));
    }
  }
  return local_4;
}

Assistant:

arm::Reg Codegen::get_or_alloc_vd(mir::inst::VarId v_) {
  auto v = get_collapsed_var(v_);
  auto found = reg_map.find(v);
  if (found != reg_map.end()) {
    assert(arm::register_type(found->second) ==
           arm::RegisterKind::VirtualDoubleVector);
    return found->second;
  } else {
    auto reg = alloc_vd();
    reg_map.insert({v, reg});
    if (v_ != v) reg_map.insert({v_, reg});
    return reg;
  }
}